

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

QAbstractFileEngine * __thiscall QFilePrivate::engine(QFilePrivate *this)

{
  long lVar1;
  bool bVar2;
  pointer pQVar3;
  unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
  *in_stack_ffffffffffffffd8;
  QString *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     0x1224b1);
  if (!bVar2) {
    QAbstractFileEngine::create(in_stack_fffffffffffffff0);
    std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator=
              (in_RDI,in_stack_ffffffffffffffd8);
    std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::~unique_ptr
              (in_RDI);
  }
  pQVar3 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::get
                     ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                      0x1224fc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractFileEngine *QFilePrivate::engine() const
{
    if (!fileEngine)
        fileEngine = QAbstractFileEngine::create(fileName);
    return fileEngine.get();
}